

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  float fVar3;
  ImGuiCond IVar4;
  int iVar5;
  ImVec2 pos;
  ImVec2 IVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ImVec2 p_min;
  ImVec2 p_max;
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  ImGuiID IVar14;
  ImU32 IVar15;
  ImGuiWindow *pIVar16;
  ImGuiContext *g;
  ImGuiWindow *pIVar17;
  ImGuiPopupPositionPolicy in_R9D;
  ImRect *align;
  char cVar18;
  uint uVar19;
  ImGuiStorage *this;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar21;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImRect r_outer;
  ImRect value_bb;
  ImVec2 size_contents;
  ImRect total_bb;
  bool local_f6;
  char local_f5;
  ImGuiID local_f4;
  bool local_ed;
  uint local_ec;
  ImRect local_e8;
  undefined1 local_d8 [16];
  ImGuiCond local_bc;
  ImVec4 local_b8;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ImDrawList *local_98;
  char *local_90;
  ImRect local_88;
  undefined1 local_78 [24];
  undefined8 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar12 = GImGui;
  IVar4 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar16 = pIVar12->CurrentWindow;
  pIVar16->WriteAccessed = true;
  if (pIVar16->SkipItems != false) {
    return false;
  }
  local_90 = preview_value;
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2aee,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  IVar14 = ImGuiWindow::GetID(pIVar16,label,(char *)0x0);
  local_d8._0_4_ = 0.0;
  if ((flags & 0x20U) == 0) {
    fVar20 = (GImGui->Style).FramePadding.y;
    local_d8._0_4_ = fVar20 + fVar20 + GImGui->FontSize;
  }
  IVar6 = CalcTextSize(label,(char *)0x0,true,-1.0);
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_4_ = IVar6.x;
  local_78._4_4_ = IVar6.y;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_a8 = (float)local_d8._0_4_;
  fVar20 = IVar6.x;
  fVar21 = IVar6.y;
  if ((flags & 0x40U) == 0) {
    local_a8 = CalcItemWidth();
    uStack_a4 = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc_00;
    uStack_9c = extraout_XMM0_Dd_00;
    fVar20 = (float)local_78._0_4_;
    fVar21 = (float)local_78._4_4_;
  }
  fVar3 = (pIVar12->Style).FramePadding.y;
  local_e8.Min.x = (pIVar16->DC).CursorPos.x;
  local_e8.Min.y = (pIVar16->DC).CursorPos.y;
  local_e8.Max.x = local_a8 + local_e8.Min.x;
  local_e8.Max.y = fVar3 + fVar3 + fVar21 + local_e8.Min.y;
  local_40.Max.x = 0.0;
  if (0.0 < fVar20) {
    local_40.Max.x = (pIVar12->Style).ItemInnerSpacing.x + fVar20;
  }
  local_40.Max.x = local_40.Max.x + local_e8.Max.x;
  local_40.Max.y = local_e8.Max.y + 0.0;
  local_b8.y = local_40.Max.y - local_e8.Min.y;
  local_b8.x = local_40.Max.x - local_e8.Min.x;
  local_f4 = IVar14;
  local_40.Min.x = local_e8.Min.x;
  local_40.Min.y = local_e8.Min.y;
  ItemSize((ImVec2 *)&local_b8,fVar3);
  IVar14 = local_f4;
  bVar13 = ItemAdd(&local_40,local_f4,&local_e8);
  if (!bVar13) {
    return false;
  }
  uVar19 = 0;
  local_bc = IVar4;
  local_f5 = ButtonBehavior(&local_e8,IVar14,&local_f6,&local_ed,0);
  iVar5 = (GImGui->CurrentPopupStack).Size;
  if (iVar5 < (GImGui->OpenPopupStack).Size) {
    uVar19 = (uint)((GImGui->OpenPopupStack).Data[iVar5].PopupId == IVar14);
  }
  local_60 = CONCAT44(local_e8.Min.y,local_e8.Min.x);
  local_58.y = local_e8.Max.y;
  local_58.x = local_e8.Max.x - (float)local_d8._0_4_;
  pIVar1 = (GImGui->Style).Colors + (ulong)local_f6 + 7;
  local_b8.x = pIVar1->x;
  local_b8.y = pIVar1->y;
  uVar7 = pIVar1->z;
  uVar8 = pIVar1->w;
  local_b8.w = (GImGui->Style).Alpha * (float)uVar8;
  local_b8.z = (float)uVar7;
  local_ec = uVar19;
  IVar15 = ColorConvertFloat4ToU32(&local_b8);
  RenderNavHighlight(&local_e8,IVar14,1);
  if ((flags & 0x40U) == 0) {
    local_b8.y = local_e8.Max.y;
    local_b8.x = local_e8.Max.x - (float)local_d8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar16->DrawList,&local_e8.Min,(ImVec2 *)&local_b8,IVar15,
               (pIVar12->Style).FrameRounding,5);
  }
  if ((flags & 0x20U) == 0) {
    local_98 = pIVar16->DrawList;
    local_88.Min.y = local_e8.Min.y;
    local_88.Min.x = local_e8.Max.x - (float)local_d8._0_4_;
    puVar2 = (undefined8 *)
             ((long)&(GImGui->Style).Colors[0x15].x +
             (ulong)(((local_f6 | (byte)local_ec) & 1) << 4));
    local_b8._0_8_ = *puVar2;
    uVar9 = puVar2[1];
    local_b8.w = (float)((ulong)uVar9 >> 0x20);
    local_b8.z = (float)uVar9;
    local_b8.w = (GImGui->Style).Alpha * local_b8.w;
    IVar15 = ColorConvertFloat4ToU32(&local_b8);
    ImDrawList::AddRectFilled
              (local_98,&local_88.Min,&local_e8.Max,IVar15,(pIVar12->Style).FrameRounding,
               (uint)(local_a8 <= (float)local_d8._0_4_) * 5 + 10);
    fVar20 = (pIVar12->Style).FramePadding.y;
    IVar6.y = fVar20 + local_e8.Min.y;
    IVar6.x = fVar20 + (local_e8.Max.x - (float)local_d8._0_4_);
    RenderArrow(IVar6,3,1.0);
  }
  p_min.y = local_e8.Min.y;
  p_min.x = local_e8.Min.x;
  p_max.y = local_e8.Max.y;
  p_max.x = local_e8.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar12->Style).FrameRounding);
  IVar4 = local_bc;
  if (local_90 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar6 = (pIVar12->Style).FramePadding;
    local_b8.x = IVar6.x + local_e8.Min.x;
    local_b8.y = IVar6.y + local_e8.Min.y;
    align = &local_88;
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_88.Max.x;
    auVar10._4_4_ = local_88.Max.y;
    local_88 = (ImRect)(auVar10 << 0x40);
    RenderTextClipped((ImVec2 *)&local_b8,&local_58,local_90,(char *)0x0,(ImVec2 *)0x0,&align->Min,
                      (ImRect *)0x0);
    in_R9D = (ImGuiPopupPositionPolicy)align;
  }
  uVar19 = local_ec;
  if (0.0 < (float)local_78._0_4_) {
    pos.y = (pIVar12->Style).FramePadding.y + local_e8.Min.y;
    pos.x = (pIVar12->Style).ItemInnerSpacing.x + local_e8.Max.x;
    RenderText(pos,label,(char *)0x0,true);
  }
  cVar18 = (char)uVar19;
  if (local_f5 == '\0') {
    if (pIVar12->NavActivateId == local_f4 && cVar18 == '\0') {
LAB_0015e4f2:
      if ((pIVar16->DC).NavLayerCurrent == 0) {
        pIVar16->NavLastIds[0] = local_f4;
      }
      OpenPopupEx(local_f4);
    }
    else if (cVar18 == '\0') {
      return false;
    }
  }
  else if (cVar18 == '\0') goto LAB_0015e4f2;
  pIVar11 = GImGui;
  if (IVar4 != 0) {
    (pIVar12->NextWindowData).SizeConstraintCond = IVar4;
    fVar20 = (pIVar12->NextWindowData).SizeConstraintRect.Min.x;
    uVar19 = -(uint)(local_a8 <= fVar20);
    (pIVar12->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar19 & (uint)local_a8 | (uint)fVar20 & uVar19);
    goto LAB_0015e612;
  }
  uVar19 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar19 = flags;
  }
  flags = uVar19;
  uVar19 = (flags & 0x1eU) - 1;
  if ((flags & 0x1eU ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2b24,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  if ((flags & 4U) == 0) {
    if ((flags & 2U) != 0) {
      fVar20 = 4.0;
      goto LAB_0015e5aa;
    }
    if ((flags & 8U) != 0) {
      fVar20 = 20.0;
      goto LAB_0015e5aa;
    }
    fVar20 = 3.4028235e+38;
  }
  else {
    fVar20 = 8.0;
LAB_0015e5aa:
    fVar21 = (GImGui->Style).WindowPadding.y;
    fVar3 = (GImGui->Style).ItemSpacing.y;
    fVar20 = fVar21 + fVar21 + ((GImGui->FontSize + fVar3) * fVar20 - fVar3);
  }
  (GImGui->NextWindowData).SizeConstraintCond = 1;
  (pIVar11->NextWindowData).SizeConstraintRect.Min.x = local_a8;
  *(undefined8 *)&(pIVar11->NextWindowData).SizeConstraintRect.Min.y = 0x7f7fffff00000000;
  (pIVar11->NextWindowData).SizeConstraintRect.Max.y = fVar20;
  (pIVar11->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
  (pIVar11->NextWindowData).SizeCallbackUserData = (void *)0x0;
LAB_0015e612:
  ImFormatString((char *)&local_b8,0x10,"##Combo_%02d",
                 (ulong)(uint)(pIVar12->CurrentPopupStack).Size);
  this = &GImGui->WindowsById;
  IVar15 = ImHash(&local_b8,0,0);
  pIVar16 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(this,IVar15);
  if ((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->WasActive == true)) {
    local_48 = CalcSizeContents(pIVar16);
    IVar6 = CalcSizeAutoFit(pIVar16,&local_48);
    pIVar17 = pIVar16;
    IVar6 = CalcSizeAfterConstraint(pIVar16,IVar6);
    local_d8._8_4_ = extraout_XMM0_Dc_01;
    local_d8._0_4_ = IVar6.x;
    local_d8._4_4_ = IVar6.y;
    local_d8._12_4_ = extraout_XMM0_Dd_01;
    if ((flags & 1U) != 0) {
      pIVar16->AutoPosLastDirection = 0;
    }
    local_88 = FindAllowedExtentRectForWindow(pIVar17);
    local_50.y = local_e8.Max.y;
    local_50.x = local_e8.Min.x;
    IVar6 = FindBestWindowPosForPopupEx
                      (&local_50,(ImVec2 *)&pIVar16->AutoPosLastDirection,(ImGuiDir *)&local_88,
                       &local_e8,(ImRect *)0x1,in_R9D);
    pIVar11 = GImGui;
    (GImGui->NextWindowData).PosVal = IVar6;
    (pIVar11->NextWindowData).PosPivotVal.x = 0.0;
    (pIVar11->NextWindowData).PosPivotVal.y = 0.0;
    (pIVar11->NextWindowData).PosCond = 1;
  }
  local_88.Min.y = (pIVar12->Style).WindowPadding.y;
  local_88.Min.x = (pIVar12->Style).FramePadding.x;
  PushStyleVar(1,&local_88.Min);
  bVar13 = Begin((char *)&local_b8,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar13) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2b44,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.CurrentPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_contents = CalcSizeContents(popup_window);
            ImVec2 size_expected = CalcSizeAfterConstraint(popup_window, CalcSizeAutoFit(popup_window, size_contents));
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = FindAllowedExtentRectForWindow(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}